

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_bcfill.cpp
# Opt level: O0

void __thiscall
PeleLMdummyFill::operator()
          (PeleLMdummyFill *this,IntVect *iv,Array4<double> *dest,int dcomp,int param_5,
          GeometryData *geom,Real param_7,BCRec *bcr,int param_9,int param_10)

{
  int *piVar1;
  int *piVar2;
  int in_ECX;
  long *in_RDX;
  int *in_RSI;
  long in_R9;
  int *in_stack_00000008;
  int idir;
  Real s_ext [1];
  int *bc;
  int *domhi;
  int *domlo;
  
  piVar1 = amrex::Box::loVect((Box *)(in_R9 + 0x30));
  piVar2 = amrex::Box::hiVect((Box *)(in_R9 + 0x30));
  if ((*in_stack_00000008 == 3) && (*in_RSI < *piVar1)) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  else if ((in_stack_00000008[3] == 3) && (*piVar2 < *in_RSI)) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  if ((in_stack_00000008[1] == 3) && (in_RSI[1] < piVar1[1])) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  else if ((in_stack_00000008[4] == 3) && (piVar2[1] < in_RSI[1])) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  if ((in_stack_00000008[2] == 3) && (in_RSI[2] < piVar1[2])) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  else if ((in_stack_00000008[5] == 3) && (piVar2[2] < in_RSI[2])) {
    *(undefined8 *)
     (*in_RDX +
     ((long)(*in_RSI - (int)in_RDX[4]) +
      (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
      (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)in_ECX * in_RDX[3]) * 8) =
         0x484223ac4217a08b;
  }
  return;
}

Assistant:

AMREX_GPU_DEVICE
  void operator()(
    const amrex::IntVect& iv,
    amrex::Array4<amrex::Real> const& dest,
    const int dcomp,
    const int /*numcomp*/,
    amrex::GeometryData const& geom,
    const amrex::Real /*time*/,
    const amrex::BCRec* bcr,
    const int /*bcomp*/,
    const int /*orig_comp*/) const
  {
    const int* domlo = geom.Domain().loVect();
    const int* domhi = geom.Domain().hiVect();
    
    const int* bc = bcr->data();

    // Shouldn't actually ever use this, just need something computable.
    // Set to some ridiculous value so we know if it does get used.
    amrex::Real s_ext[1] = {1.2345e40};

    // xlo and xhi
    int idir = 0;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    
    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    }


    // ylo and yhi
    idir = 1;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

      dest(iv, dcomp) = s_ext[0];

    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	 dest(iv, dcomp) = s_ext[0];
    }

#if AMREX_SPACEDIM == 3
    // zlo and zhi
    idir = 2;
    if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {

	 dest(iv, dcomp) = s_ext[0];

    } else if (
       (bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and
       (iv[idir] > domhi[idir])) {

	  dest(iv, dcomp) = s_ext[0];
    }
#endif
  }